

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool __thiscall AActor::CheckLocalView(AActor *this,int playernum)

{
  bool bVar1;
  long lVar2;
  AActor *pAVar3;
  
  lVar2 = (long)playernum;
  pAVar3 = (AActor *)(&DAT_017e5fc8)[lVar2 * 0x54];
  if ((pAVar3 != (AActor *)0x0) &&
     (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (&DAT_017e5fc8)[lVar2 * 0x54] = 0;
    pAVar3 = (AActor *)0x0;
  }
  bVar1 = true;
  if (pAVar3 != this) {
    if (((AActor *)(&players)[lVar2 * 0x54] == this) && ((&DAT_017e5fc8)[lVar2 * 0x54] != 0)) {
      if ((*(byte *)((&DAT_017e5fc8)[lVar2 * 0x54] + 0x20) & 0x20) == 0) {
        if ((*(long *)((&DAT_017e5fc8)[lVar2 * 0x54] + 0x230) == 0) &&
           ((*(byte *)((&DAT_017e5fc8)[lVar2 * 0x54] + 0x1c5) & 0x20) == 0)) {
          return true;
        }
      }
      else {
        (&DAT_017e5fc8)[lVar2 * 0x54] = 0;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AActor::CheckLocalView (int playernum) const
{
	if (players[playernum].camera == this)
	{
		return true;
	}
	if (players[playernum].mo != this || players[playernum].camera == NULL)
	{
		return false;
	}
	if (players[playernum].camera->player == NULL &&
		!(players[playernum].camera->flags3 & MF3_ISMONSTER))
	{
		return true;
	}
	return false;
}